

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityHBMatrix.cpp
# Opt level: O3

void __thiscall
OpenMD::TetrahedralityHBMatrix::TetrahedralityHBMatrix
          (TetrahedralityHBMatrix *this,SimInfo *info,string *filename,string *sele,double rCut,
          double OOcut,double thetaCut,double OHcut,int nbins)

{
  SelectionEvaluator *this_00;
  uint uVar1;
  pointer pcVar2;
  double dVar3;
  long *plVar4;
  size_type __new_size;
  ostream *poVar5;
  OpenMDBitSet *pOVar6;
  ulong uVar7;
  long lVar8;
  string paramString;
  stringstream params;
  string local_208;
  SelectionManager *local_1e8;
  string *local_1e0;
  RealType local_1d8;
  RealType local_1d0;
  RealType local_1c8;
  RealType local_1c0;
  undefined1 local_1b8 [16];
  OpenMDBitSet local_1a8 [2];
  ios_base local_138 [264];
  
  local_1d8 = rCut;
  local_1d0 = OOcut;
  local_1c8 = thetaCut;
  local_1c0 = OHcut;
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser =
       (_func_int **)&PTR__TetrahedralityHBMatrix_003378a8;
  (this->selectionScript_)._M_dataplus._M_p = (pointer)&(this->selectionScript_).field_2;
  pcVar2 = (sele->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript_,pcVar2,pcVar2 + sele->_M_string_length);
  local_1e8 = &this->seleMan_;
  local_1e0 = &this->selectionScript_;
  SelectionManager::SelectionManager(local_1e8,info);
  this_00 = &this->evaluator_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  this->rCut_ = local_1d8;
  this->OOCut_ = local_1d0;
  this->thetaCut_ = local_1c8;
  this->OHCut_ = local_1c0;
  (this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Q_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Q_histogram_).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Q_histogram_).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Q_histogram_).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8._0_8_ = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,"Tetrahedrality HBond Matrix","");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).analysisType_);
  if ((OpenMDBitSet *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)
                                    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  getPrefix(&local_208,filename);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_208);
  pOVar6 = (OpenMDBitSet *)(plVar4 + 2);
  if ((OpenMDBitSet *)*plVar4 == pOVar6) {
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p =
         (pOVar6->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._8_8_ = plVar4[3];
    local_1b8._0_8_ = local_1a8;
  }
  else {
    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
    ._M_start.super__Bit_iterator_base._M_p =
         (pOVar6->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_1b8._0_8_ = (OpenMDBitSet *)*plVar4;
  }
  local_1b8._8_8_ = plVar4[1];
  *plVar4 = (long)pOVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  if ((OpenMDBitSet *)local_1b8._0_8_ != local_1a8) {
    operator_delete((void *)local_1b8._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)
                                    local_1a8[0].bitset_.super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl.super__Bvector_impl_data._M_start.
                                    super__Bit_iterator_base._M_p)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  SelectionEvaluator::loadScriptString(this_00,sele);
  if ((this->evaluator_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_1b8,this_00);
    lVar8 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar8),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_1b8._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar8));
      lVar8 = lVar8 + 0x28;
    } while (lVar8 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_1b8);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(&this->Q_histogram_,(ulong)(this->super_StaticAnalyser).nBins_);
  uVar1 = (this->super_StaticAnalyser).nBins_;
  __new_size = (size_type)uVar1;
  if (uVar1 == 0) {
    dVar3 = 0.0;
  }
  else {
    lVar8 = 0;
    uVar7 = 0;
    do {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(((this->Q_histogram_).
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data + lVar8),__new_size);
      uVar7 = uVar7 + 1;
      uVar1 = (this->super_StaticAnalyser).nBins_;
      __new_size = (size_type)uVar1;
      lVar8 = lVar8 + 0x18;
    } while (uVar7 < __new_size);
    dVar3 = (double)uVar1;
  }
  this->MinQ_ = 0.0;
  this->MaxQ_ = 1.1;
  this->deltaQ_ = 1.1 / dVar3;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," rCut = ",8);
  poVar5 = std::ostream::_M_insert<double>(this->rCut_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", OOcut = ",10);
  poVar5 = std::ostream::_M_insert<double>(this->OOCut_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", thetacut = ",0xd);
  poVar5 = std::ostream::_M_insert<double>(this->thetaCut_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", OHcut = ",10);
  poVar5 = std::ostream::_M_insert<double>(this->OHCut_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", nbins = ",10);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", deltaQ = ",0xb);
  std::ostream::_M_insert<double>(this->deltaQ_);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).paramString_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

TetrahedralityHBMatrix::TetrahedralityHBMatrix(
      SimInfo* info, const std::string& filename, const std::string& sele,
      double rCut, double OOcut, double thetaCut, double OHcut, int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript_(sele), seleMan_(info), evaluator_(info), rCut_(rCut),
      OOCut_(OOcut), thetaCut_(thetaCut), OHCut_(OHcut) {
    setAnalysisType("Tetrahedrality HBond Matrix");
    setOutputName(getPrefix(filename) + ".hbq");

    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    Q_histogram_.resize(nBins_);

    for (unsigned int i = 0; i < nBins_; i++) {
      Q_histogram_[i].resize(nBins_);
    }

    // Q can take values from 0 to 1

    MinQ_   = 0.0;
    MaxQ_   = 1.1;
    deltaQ_ = (MaxQ_ - MinQ_) / nBins_;

    std::stringstream params;
    params << " rCut = " << rCut_ << ", OOcut = " << OOCut_
           << ", thetacut = " << thetaCut_ << ", OHcut = " << OHCut_
           << ", nbins = " << nBins_ << ", deltaQ = " << deltaQ_;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }